

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

TPZVec<double> * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution
          (TPZVec<double> *__return_storage_ptr__,
          TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int var)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  long *plVar8;
  TPZIntPoints *rval;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_3> intorder;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_10> result;
  TPZManVector<double,_3> intpoint;
  TPZManVector<double,_10> solout;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_19af0;
  long lStack_19ae8;
  int iStack_19ae0;
  int iStack_19adc;
  double dStack_19ad8;
  undefined **ppuStack_19ad0;
  TPZGeoEl *pTStack_19ac8;
  TPZManVector<int,_3> TStack_19ac0;
  long *plStack_19a90;
  TPZVec<double> *pTStack_19a88;
  long *plStack_19a80;
  double dStack_19a78;
  TPZManVector<int,_3> TStack_19a70;
  TPZManVector<double,_3> TStack_19a40;
  TPZManVector<double,_10> TStack_19a08;
  TPZFMatrix<double> TStack_19998;
  TPZManVector<double,_3> TStack_19908;
  TPZManVector<double,_10> TStack_198d0;
  TPZFMatrix<double> TStack_19860;
  TPZFMatrix<double> TStack_197d0;
  TPZManVector<TPZTransform<double>,_10> TStack_19740;
  TPZManVector<TPZMaterialDataT<double>,_3> TStack_186e0;
  
  TPZManVector<double,_10>::TPZManVector(&TStack_19a08,0);
  plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                               0xb8))(this);
  if (plVar7 == (long *)0x0) {
    plVar8 = (long *)0x0;
  }
  else {
    plVar8 = (long *)__dynamic_cast(plVar7,&TPZMaterial::typeinfo,
                                    &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
  }
  if (plVar7 == (long *)0x0 || plVar8 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual TPZVec<STATE> TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution(int) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
  }
  else {
    iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                      (this);
    if (iVar3 != 0) {
      plStack_19a80 = plVar7;
      TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector(&TStack_186e0,0);
      lVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      (*TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])(&TStack_186e0,lVar10);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
                (this,&TStack_186e0,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_19740,0);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                (this,&TStack_19740);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                        (this);
      TStack_19af0.fRef = (TPZReference *)operator_new(0x10);
      (TStack_19af0.fRef)->fPointer = (TPZIntPoints *)0x0;
      ((TStack_19af0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      LOCK();
      ((TStack_19af0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      lVar12 = (long)iVar3;
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&TStack_19908,lVar12,(double *)&TStack_19998);
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      iStack_19ae0 = var;
      plStack_19a90 = plVar8;
      TPZManVector<double,_3>::TPZManVector(&TStack_19a40,lVar12,(double *)&TStack_19998);
      dStack_19ad8 = 0.0;
      lStack_19ae8 = lVar12;
      pTStack_19a88 = __return_storage_ptr__;
      TPZVec<int>::TPZVec(&TStack_19ac0.super_TPZVec<int>,0);
      TStack_19ac0.super_TPZVec<int>.fStore = TStack_19ac0.fExtAlloc;
      ppuStack_19ad0 = &PTR__TPZManVector_018437d0;
      TStack_19ac0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
      TStack_19ac0.super_TPZVec<int>.fNElements = 0;
      TStack_19ac0.super_TPZVec<int>.fNAlloc = 0;
      if (0 < lVar10) {
        lVar13 = 0;
        lVar12 = 0;
        do {
          *(undefined1 *)
           ((long)(&((TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                    super_TPZMaterialData).phi.super_TPZFMatrix<double>.fPivot + -2) + 0x30 + lVar13
           ) = 1;
          lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar12);
          if (lVar1 == 0) {
            plVar7 = (long *)0x0;
          }
          else {
            plVar7 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
          }
          if (plVar7 != (long *)0x0) {
            TPZManVector<int,_3>::Resize
                      (&TStack_19ac0,TStack_19ac0.super_TPZVec<int>.fNElements + 1);
            iVar2 = TStack_19ac0.super_TPZVec<int>.fNElements;
            uVar4 = (**(code **)(*plVar7 + 0x268))(plVar7);
            *(undefined4 *)
             ((long)(&((TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                      super_TPZMaterialData).XCenter + -1) + lVar13 + 0x20) = uVar4;
            *(undefined4 *)
             ((long)TStack_19ac0.super_TPZVec<int>.fStore + ((iVar2 << 0x20) + -0x100000000 >> 0x1e)
             ) = uVar4;
          }
          lVar12 = lVar12 + 0x10;
          lVar13 = lVar13 + 0x8230;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      iStack_19adc = (**(code **)(*plStack_19a90 + 0x48))(plStack_19a90,&TStack_19ac0);
      pTStack_19ac8 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar3 = iStack_19ae0;
      lVar10 = lStack_19ae8;
      iVar5 = (**(code **)(*(long *)pTStack_19ac8 + 0xf0))();
      rval = (TPZIntPoints *)
             (**(code **)(*(long *)pTStack_19ac8 + 0x70))(pTStack_19ac8,iVar5 + -1,iStack_19adc);
      TPZAutoPointer<TPZIntPoints>::operator=(&TStack_19af0,rval);
      TPZManVector<int,_3>::TPZManVector(&TStack_19a70,lVar10,&iStack_19adc);
      (*(TStack_19af0.fRef)->fPointer->_vptr_TPZIntPoints[5])
                ((TStack_19af0.fRef)->fPointer,&TStack_19a70,0);
      iVar5 = (*(TStack_19af0.fRef)->fPointer->_vptr_TPZIntPoints[3])();
      lStack_19ae8 = CONCAT44(lStack_19ae8._4_4_,iVar5);
      if (1000 < iVar5) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                   ,0x417);
      }
      uVar6 = (**(code **)(*plStack_19a80 + 0x88))(plStack_19a80,iVar3);
      TPZManVector<double,_10>::TPZManVector(&TStack_198d0,(long)iVar3);
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_10>::Resize(&TStack_19a08,(long)(int)uVar6,(double *)&TStack_19998);
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_19998.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_19998.fElem = (double *)0x0;
      TStack_19998.fGiven = (double *)0x0;
      TStack_19998.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_19998.fPivot.super_TPZVec<int>,0);
      TStack_19998.fPivot.super_TPZVec<int>.fStore = TStack_19998.fPivot.fExtAlloc;
      TStack_19998.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_19998.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_19998.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_19998.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_19998.fWork.fStore = (double *)0x0;
      TStack_19998.fWork.fNElements = 0;
      TStack_19998.fWork.fNAlloc = 0;
      TStack_197d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_197d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_197d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_197d0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_197d0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_197d0.fElem = (double *)0x0;
      TStack_197d0.fGiven = (double *)0x0;
      TStack_197d0.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_197d0.fPivot.super_TPZVec<int>,0);
      TStack_197d0.fPivot.super_TPZVec<int>.fStore = TStack_197d0.fPivot.fExtAlloc;
      TStack_197d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_197d0.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_197d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_197d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_197d0.fWork.fStore = (double *)0x0;
      TStack_197d0.fWork.fNElements = 0;
      TStack_197d0.fWork.fNAlloc = 0;
      TStack_19860.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_19860.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_19860.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_19860.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_19860.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_19860.fElem = (double *)0x0;
      TStack_19860.fGiven = (double *)0x0;
      TStack_19860.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_19860.fPivot.super_TPZVec<int>,0);
      TStack_19860.fPivot.super_TPZVec<int>.fStore = TStack_19860.fPivot.fExtAlloc;
      TStack_19860.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_19860.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_19860.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_19860.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_19860.fWork.fStore = (double *)0x0;
      TStack_19860.fWork.fNElements = 0;
      TStack_19860.fWork.fNAlloc = 0;
      if (0 < (int)(uint)lStack_19ae8) {
        uVar11 = 0;
        do {
          (*(TStack_19af0.fRef)->fPointer->_vptr_TPZIntPoints[4])
                    ((TStack_19af0.fRef)->fPointer,(ulong)uVar11,&TStack_19a40,&dStack_19ad8);
          TPZGeoEl::Jacobian(pTStack_19ac8,&TStack_19a40.super_TPZVec<double>,&TStack_19998,
                             &TStack_197d0,&dStack_19a78,&TStack_19860);
          dStack_19ad8 = ABS(dStack_19a78) * dStack_19ad8;
          ((TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->super_TPZMaterialData).
          intLocPtIndex = uVar11;
          TStack_186e0.super_TPZVec<TPZMaterialDataT<double>_>.fStore[1].super_TPZMaterialData.
          intLocPtIndex = uVar11;
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2a8))
                    (this,&TStack_19a40,&TStack_19740,&TStack_186e0);
          (**(code **)(*plStack_19a90 + 0x88))
                    (plStack_19a90,&TStack_186e0,iStack_19ae0,&TStack_198d0);
          if (0 < (int)uVar6) {
            uVar9 = 0;
            do {
              TStack_19a08.super_TPZVec<double>.fStore[uVar9] =
                   dStack_19ad8 * TStack_198d0.super_TPZVec<double>.fStore[uVar9] +
                   TStack_19a08.super_TPZVec<double>.fStore[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)lStack_19ae8);
      }
      __return_storage_ptr__ = pTStack_19a88;
      TPZVec<double>::TPZVec(pTStack_19a88,&TStack_19a08.super_TPZVec<double>);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_19860);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_197d0);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_19998);
      TPZManVector<double,_10>::~TPZManVector(&TStack_198d0);
      if (TStack_19a70.super_TPZVec<int>.fStore == TStack_19a70.fExtAlloc) {
        TStack_19a70.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_19a70.super_TPZVec<int>.fNAlloc = 0;
      TStack_19a70.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_19a70.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_19a70.super_TPZVec<int>.fStore);
      }
      if (TStack_19ac0.super_TPZVec<int>.fStore == TStack_19ac0.fExtAlloc) {
        TStack_19ac0.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_19ac0.super_TPZVec<int>.fNAlloc = 0;
      TStack_19ac0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_19ac0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_19ac0.super_TPZVec<int>.fStore);
      }
      TPZManVector<double,_3>::~TPZManVector(&TStack_19a40);
      TPZManVector<double,_3>::~TPZManVector(&TStack_19908);
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_19af0);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_19740);
      TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector(&TStack_186e0);
      goto LAB_011f91be;
    }
  }
  TPZVec<double>::TPZVec(__return_storage_ptr__,&TStack_19a08.super_TPZVec<double>);
LAB_011f91be:
  TPZManVector<double,_10>::~TPZManVector(&TStack_19a08);
  return __return_storage_ptr__;
}

Assistant:

TPZVec<STATE> TPZMultiphysicsCompEl<TGeometry>::IntegrateSolution(int var) const
{
    TPZManVector<STATE> result;
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<STATE>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return result;
    }
    
    if (this->NConnects() == 0) return result;//boundary discontinuous elements have this characteristic
    
    TPZMultiphysicsCompEl<TGeometry> *thisnonconst = (TPZMultiphysicsCompEl<TGeometry> *) this;
    
    TPZManVector<TPZMaterialDataT<STATE>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    thisnonconst->InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        datavec[iref].fNeedsSol = true;
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    int nvar = material->NSolutionVariables(var);
    TPZManVector<STATE> solout(var);
    result.Resize(nvar, 0.);
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        datavec[0].intLocPtIndex = int_ind;
        datavec[1].intLocPtIndex = int_ind;
        
        
        thisnonconst->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Solution(datavec, var, solout);
        
        for (int iv=0; iv<nvar; iv++) {
            result[iv] += weight*solout[iv];
        }
        
    }//loop over integratin points
    
    return result;
}